

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cpp
# Opt level: O2

void __thiscall
RVO::KdTree::buildAgentTreeRecursive(KdTree *this,size_t begin,size_t end,size_t node)

{
  float *pfVar1;
  long lVar2;
  Vector2 VVar3;
  pointer ppAVar4;
  Agent *pAVar5;
  undefined1 auVar6 [16];
  pointer pAVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar17;
  undefined4 uVar18;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined4 uVar19;
  float fVar20;
  float fVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined1 auVar24 [16];
  ulong uVar11;
  
  pAVar7 = (this->agentTree_).
           super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pAVar7[node].begin = begin;
    pAVar7[node].end = end;
    ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    VVar3 = ppAVar4[begin]->position_;
    fVar20 = VVar3.x_;
    fVar21 = VVar3.y_;
    uVar22 = 0;
    uVar23 = 0;
    pAVar7[node].minX = fVar20;
    pAVar7[node].maxX = VVar3.x_;
    pAVar7[node].maxY = VVar3.y_;
    fVar13 = fVar20;
    fVar17 = fVar21;
    uVar18 = uVar22;
    uVar19 = uVar23;
    sVar8 = begin;
    while (sVar8 = sVar8 + 1, sVar8 < end) {
      VVar3 = ppAVar4[sVar8]->position_;
      auVar15._8_8_ = 0;
      auVar15._0_4_ = VVar3.x_;
      auVar15._4_4_ = VVar3.y_;
      auVar24._8_8_ = 0;
      auVar24._0_4_ = VVar3.x_;
      auVar24._4_4_ = VVar3.y_;
      auVar16._4_4_ = fVar21;
      auVar16._0_4_ = fVar20;
      auVar16._8_4_ = uVar22;
      auVar16._12_4_ = uVar23;
      auVar24 = maxps(auVar24,auVar16);
      pAVar7[node].maxX = (float)(int)auVar24._0_8_;
      pAVar7[node].maxY = (float)(int)((ulong)auVar24._0_8_ >> 0x20);
      auVar6._4_4_ = fVar17;
      auVar6._0_4_ = fVar13;
      auVar6._8_4_ = uVar18;
      auVar6._12_4_ = uVar19;
      auVar16 = minps(auVar15,auVar6);
      fVar13 = auVar16._0_4_;
      pAVar7[node].minX = fVar13;
      fVar20 = auVar24._0_4_;
      fVar21 = auVar24._4_4_;
      uVar22 = auVar24._8_4_;
      uVar23 = auVar24._12_4_;
      fVar17 = auVar16._4_4_;
      uVar18 = auVar16._8_4_;
      uVar19 = auVar16._12_4_;
    }
    pAVar7[node].minY = fVar17;
    if (end - begin < 0xb) {
      return;
    }
    uVar12 = -(uint)(fVar21 - fVar17 < fVar20 - fVar13);
    fVar14 = (float)(~uVar12 & (uint)(fVar21 + fVar17) | uVar12 & (uint)(fVar20 + fVar13)) * 0.5;
    lVar2 = (ulong)(fVar20 - fVar13 <= fVar21 - fVar17) * 4;
    sVar8 = begin;
    sVar9 = end;
LAB_0010ac2c:
    if (sVar8 < sVar9) {
      ppAVar4 = (this->agents_).super__Vector_base<RVO::Agent_*,_std::allocator<RVO::Agent_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      while ((uVar11 = sVar9, sVar9 != sVar8 &&
             (pfVar1 = (float *)((long)&(ppAVar4[sVar8]->position_).x_ + lVar2), uVar11 = sVar8,
             *pfVar1 <= fVar14 && fVar14 != *pfVar1))) {
        sVar8 = sVar8 + 1;
      }
      sVar8 = uVar11;
      uVar11 = sVar9;
      if (sVar8 < sVar9) {
        sVar9 = sVar8;
      }
      do {
        uVar10 = uVar11 - 1;
        if (uVar11 <= sVar8) goto LAB_0010ac2c;
        uVar11 = uVar10;
      } while (fVar14 <= *(float *)((long)&(ppAVar4[uVar10]->position_).x_ + lVar2));
      pAVar5 = ppAVar4[sVar8];
      ppAVar4[sVar8] = ppAVar4[uVar10];
      ppAVar4[uVar10] = pAVar5;
      sVar8 = sVar8 + 1;
      sVar9 = uVar10;
      goto LAB_0010ac2c;
    }
    sVar8 = (sVar8 == begin) + sVar8;
    pAVar7 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar7[node].left = node + 1;
    pAVar7[node].right = node + (sVar8 - begin) * 2;
    buildAgentTreeRecursive(this,begin,sVar8,node + 1);
    pAVar7 = (this->agentTree_).
             super__Vector_base<RVO::KdTree::AgentTreeNode,_std::allocator<RVO::KdTree::AgentTreeNode>_>
             ._M_impl.super__Vector_impl_data._M_start;
    node = pAVar7[node].right;
    begin = sVar8;
  } while( true );
}

Assistant:

void KdTree::buildAgentTreeRecursive(size_t begin, size_t end, size_t node)
	{
		agentTree_[node].begin = begin;
		agentTree_[node].end = end;
		agentTree_[node].minX = agentTree_[node].maxX = agents_[begin]->position_.x();
		agentTree_[node].minY = agentTree_[node].maxY = agents_[begin]->position_.y();

		for (size_t i = begin + 1; i < end; ++i) {
			agentTree_[node].maxX = std::max(agentTree_[node].maxX, agents_[i]->position_.x());
			agentTree_[node].minX = std::min(agentTree_[node].minX, agents_[i]->position_.x());
			agentTree_[node].maxY = std::max(agentTree_[node].maxY, agents_[i]->position_.y());
			agentTree_[node].minY = std::min(agentTree_[node].minY, agents_[i]->position_.y());
		}

		if (end - begin > MAX_LEAF_SIZE) {
			/* No leaf node. */
			const bool isVertical = (agentTree_[node].maxX - agentTree_[node].minX > agentTree_[node].maxY - agentTree_[node].minY);
			const float splitValue = (isVertical ? 0.5f * (agentTree_[node].maxX + agentTree_[node].minX) : 0.5f * (agentTree_[node].maxY + agentTree_[node].minY));

			size_t left = begin;
			size_t right = end;

			while (left < right) {
				while (left < right && (isVertical ? agents_[left]->position_.x() : agents_[left]->position_.y()) < splitValue) {
					++left;
				}

				while (right > left && (isVertical ? agents_[right - 1]->position_.x() : agents_[right - 1]->position_.y()) >= splitValue) {
					--right;
				}

				if (left < right) {
					std::swap(agents_[left], agents_[right - 1]);
					++left;
					--right;
				}
			}

			if (left == begin) {
				++left;
				++right;
			}

			agentTree_[node].left = node + 1;
			agentTree_[node].right = node + 2 * (left - begin);

			buildAgentTreeRecursive(begin, left, agentTree_[node].left);
			buildAgentTreeRecursive(left, end, agentTree_[node].right);
		}
	}